

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageGenerator local_88;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar1->extension_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)&local_88,
                 (FieldDescriptor *)(&pDVar1->extensions_->super_SymbolBase + lVar2),this->context_)
      ;
      ImmutableExtensionGenerator::GenerateRegistrationCode
                ((ImmutableExtensionGenerator *)&local_88,printer);
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)&local_88);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0x58;
    } while (lVar3 < pDVar1->extension_count_);
  }
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar1->nested_type_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableMessageGenerator
                (&local_88,(Descriptor *)(&pDVar1->nested_types_->super_SymbolBase + lVar2),
                 this->context_);
      GenerateExtensionRegistrationCode(&local_88,printer);
      local_88.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&PTR__ImmutableMessageGenerator_019703f0;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
      ~FieldGeneratorMap(&local_88.field_generators_);
      local_88.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&PTR__MessageGenerator_019703a8;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                *)&local_88.super_MessageGenerator.oneofs_);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa0;
    } while (lVar3 < pDVar1->nested_type_count_);
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}